

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::removeSatisfied(Solver *this,vec<unsigned_int> *cs)

{
  uint64_t *puVar1;
  uint cr;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  if ((long)cs->sz < 1) {
    puVar1 = &(this->statistics).solveSteps;
    *puVar1 = *puVar1 + (long)cs->sz;
  }
  else {
    lVar8 = 0;
    iVar7 = 0;
    do {
      puVar3 = cs->data;
      cr = puVar3[lVar8];
      puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      if ((puVar4[cr] & 3) != 1) {
        bVar5 = satisfied(this,(Clause *)(puVar4 + cr));
        if (bVar5) {
          removeSatisfiedClause(this,cr,true);
        }
        else {
          lVar6 = (long)iVar7;
          iVar7 = iVar7 + 1;
          puVar3[lVar6] = cr;
        }
      }
      lVar8 = lVar8 + 1;
      iVar2 = cs->sz;
    } while (lVar8 < iVar2);
    puVar1 = &(this->statistics).solveSteps;
    *puVar1 = *puVar1 + (long)iVar2;
    if (0 < (int)lVar8 - iVar7) {
      cs->sz = (iVar7 + iVar2) - (int)lVar8;
    }
  }
  return;
}

Assistant:

void Solver::removeSatisfied(vec<CRef> &cs)
{
    int i, j;
    for (i = j = 0; i < cs.size(); i++) {
        Clause &c = ca[cs[i]];
        if (c.mark() == 1) continue;
        if (satisfied(c))
            removeSatisfiedClause(cs[i]);
        else
            cs[j++] = cs[i];
    }
    statistics.solveSteps += cs.size();
    cs.shrink(i - j);
}